

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O1

void duckdb::GetTreeWidthHeight<duckdb::PhysicalOperator>
               (PhysicalOperator *op,idx_t *width,idx_t *height)

{
  bool bVar1;
  idx_t iVar2;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  bVar1 = anon_unknown.dwarf_a14ff2::TreeChildrenIterator::HasChildren<duckdb::PhysicalOperator>(op)
  ;
  if (bVar1) {
    *width = 0;
    *height = 0;
    pcStack_20 = std::
                 _Function_handler<void_(const_duckdb::PhysicalOperator_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:81:39)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(const_duckdb::PhysicalOperator_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:81:39)>
               ::_M_manager;
    local_38._M_unused._M_object = width;
    local_38._8_8_ = height;
    anon_unknown.dwarf_a14ff2::TreeChildrenIterator::Iterate<duckdb::PhysicalOperator>
              (op,(function<void_(const_duckdb::PhysicalOperator_&)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
    }
    iVar2 = *height + 1;
  }
  else {
    *width = 1;
    iVar2 = 1;
  }
  *height = iVar2;
  return;
}

Assistant:

static void GetTreeWidthHeight(const T &op, idx_t &width, idx_t &height) {
	if (!TreeChildrenIterator::HasChildren(op)) {
		width = 1;
		height = 1;
		return;
	}
	width = 0;
	height = 0;

	TreeChildrenIterator::Iterate<T>(op, [&](const T &child) {
		idx_t child_width, child_height;
		GetTreeWidthHeight<T>(child, child_width, child_height);
		width += child_width;
		height = MaxValue<idx_t>(height, child_height);
	});
	height++;
}